

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

iterator * __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::operator--
          (iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  IntervalMap<int,_int,_0U>::const_iterator::const_iterator
            (&__return_storage_ptr__->super_const_iterator,&this->super_const_iterator);
  IntervalMap<int,_int,_0U>::const_iterator::operator--(&this->super_const_iterator);
  return __return_storage_ptr__;
}

Assistant:

iterator operator--(int) {
        iterator tmp(*this);
        --(*this);
        return tmp;
    }